

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

void __thiscall OpenMD::SimInfo::setupSimVariables(SimInfo *this)

{
  Globals *pGVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  AtomTypeSet atomTypes;
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  local_90;
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  local_60;
  
  pGVar1 = this->simParams_;
  this->useAtomicVirial_ = (bool)(pGVar1->UseAtomicVirial).super_ParameterBase.field_0x2b;
  this->calcBoxDipole_ = false;
  if (((pGVar1->AccumulateBoxDipole).super_ParameterBase.empty_ == false) &&
     ((pGVar1->AccumulateBoxDipole).super_ParameterBase.field_0x2b == '\x01')) {
    this->calcBoxDipole_ = true;
  }
  this->calcBoxQuadrupole_ = false;
  if (((pGVar1->AccumulateBoxQuadrupole).super_ParameterBase.empty_ == false) &&
     ((pGVar1->AccumulateBoxQuadrupole).super_ParameterBase.field_0x2b == '\x01')) {
    this->calcBoxQuadrupole_ = true;
  }
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  getSimulatedAtomTypes((AtomTypeSet *)&local_60,this);
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::operator=(&local_90,&local_60);
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&local_60);
  bVar7 = false;
  bVar9 = false;
  bVar10 = false;
  bVar8 = false;
  for (p_Var6 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &local_90._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    bVar2 = AtomType::isElectrostatic(*(AtomType **)(p_Var6 + 1));
    bVar3 = AtomType::isMetal(*(AtomType **)(p_Var6 + 1));
    bVar4 = AtomType::isDirectional(*(AtomType **)(p_Var6 + 1));
    bVar5 = AtomType::isFluctuatingCharge(*(AtomType **)(p_Var6 + 1));
    bVar7 = (bool)(bVar7 | bVar2);
    bVar9 = (bool)(bVar9 | bVar3);
    bVar10 = (bool)(bVar10 | bVar4);
    bVar8 = (bool)(bVar8 | bVar5);
  }
  this->usesDirectionalAtoms_ = bVar10;
  this->usesMetallicAtoms_ = bVar9;
  this->usesElectrostaticAtoms_ = bVar7;
  this->usesFluctuatingCharges_ = bVar8;
  this->requiresPrepair_ = bVar9;
  this->requiresSkipCorrection_ = bVar7;
  this->requiresSelfCorrection_ = bVar7;
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

void SimInfo::setupSimVariables() {
    useAtomicVirial_ = simParams_->getUseAtomicVirial();
    // we only call setAccumulateBoxDipole if the accumulateBoxDipole
    // parameter is true
    calcBoxDipole_ = false;
    if (simParams_->haveAccumulateBoxDipole())
      if (simParams_->getAccumulateBoxDipole()) { calcBoxDipole_ = true; }
    // we only call setAccumulateBoxQuadrupole if the accumulateBoxQuadrupole
    // parameter is true
    calcBoxQuadrupole_ = false;
    if (simParams_->haveAccumulateBoxQuadrupole())
      if (simParams_->getAccumulateBoxQuadrupole()) {
        calcBoxQuadrupole_ = true;
      }

    AtomTypeSet::iterator i;
    AtomTypeSet atomTypes;
    atomTypes                   = getSimulatedAtomTypes();
    bool usesElectrostatic      = false;
    bool usesMetallic           = false;
    bool usesDirectional        = false;
    bool usesFluctuatingCharges = false;
    // loop over all of the atom types
    for (i = atomTypes.begin(); i != atomTypes.end(); ++i) {
      usesElectrostatic |= (*i)->isElectrostatic();
      usesMetallic |= (*i)->isMetal();
      usesDirectional |= (*i)->isDirectional();
      usesFluctuatingCharges |= (*i)->isFluctuatingCharge();
    }

#ifdef IS_MPI
    int temp;

    temp = usesDirectional;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesDirectionalAtoms_ = (temp == 0) ? false : true;

    temp = usesMetallic;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesMetallicAtoms_ = (temp == 0) ? false : true;

    temp = usesElectrostatic;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesElectrostaticAtoms_ = (temp == 0) ? false : true;

    temp = usesFluctuatingCharges;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesFluctuatingCharges_ = (temp == 0) ? false : true;
#else

    usesDirectionalAtoms_   = usesDirectional;
    usesMetallicAtoms_      = usesMetallic;
    usesElectrostaticAtoms_ = usesElectrostatic;
    usesFluctuatingCharges_ = usesFluctuatingCharges;

#endif

    requiresPrepair_        = usesMetallicAtoms_ ? true : false;
    requiresSkipCorrection_ = usesElectrostaticAtoms_ ? true : false;
    requiresSelfCorrection_ = usesElectrostaticAtoms_ ? true : false;
  }